

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlogging.cpp
# Opt level: O2

void qSetMessagePattern(QString *pattern)

{
  Type *pTVar1;
  QBasicMutex *this;
  
  this = &QMessagePattern::mutex;
  QBasicMutex::lock(&QMessagePattern::mutex);
  pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>::
           operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>
                       *)this);
  if (pTVar1->fromEnvironment == false) {
    pTVar1 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>::
             operator()((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qMessagePattern>_>
                         *)this);
    QMessagePattern::setPattern(pTVar1,pattern);
  }
  QBasicMutex::unlock(&QMessagePattern::mutex);
  return;
}

Assistant:

void qSetMessagePattern(const QString &pattern)
{
    const auto locker = qt_scoped_lock(QMessagePattern::mutex);

    if (!qMessagePattern()->fromEnvironment)
        qMessagePattern()->setPattern(pattern);
}